

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::Clara::ExeName::parse
          (InternalParseResult *__return_storage_ptr__,ExeName *this,string *param_1,
          TokenStream *tokens)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  StringRef *pSVar4;
  
  pTVar1 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar2 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  .m_type = Ok;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_type = NoMatch;
  pSVar4 = (tokens->itEnd)._M_current;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.it._M_current = (tokens->it)._M_current;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.itEnd._M_current = pSVar4;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.m_tokenBuffer.
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = pTVar2;
  *(pointer *)
   ((long)&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0
           .m_value.m_remainingTokens.m_tokenBuffer.
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data + 8) = pTVar3;
  *(pointer *)
   ((long)&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0
           .m_value.m_remainingTokens.m_tokenBuffer.
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data + 0x10) = pTVar1;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult
            ExeName::parse(std::string const&,
                           Detail::TokenStream tokens) const {
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, CATCH_MOVE(tokens)));
        }